

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void detail::AddCustomCommandToTarget
               (cmLocalGenerator *lg,cmCommandOrigin origin,cmTarget *target,
               cmCustomCommandType type,
               unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmCustomCommand *this;
  string *target_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  cmListFileBacktrace *bt;
  
  cmCustomCommand::SetEscapeAllowMakeVars
            ((cc->_M_t).
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
  this = (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
         _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  target_00 = cmTarget::GetName_abi_cxx11_(target);
  cmCustomCommand::SetTarget(this,target_00);
  byproducts = cmCustomCommand::GetByproducts_abi_cxx11_
                         ((cc->_M_t).
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  bt = cmCustomCommand::GetBacktrace
                 ((cc->_M_t).
                  super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
                  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  cmLocalGenerator::AddTargetByproducts(lg,target,byproducts,bt,origin);
  if (type == POST_BUILD) {
    cmTarget::AddPostBuildCommand
              (target,(cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  }
  else if (type == PRE_LINK) {
    cmTarget::AddPreLinkCommand
              (target,(cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  }
  else if (type == PRE_BUILD) {
    cmTarget::AddPreBuildCommand
              (target,(cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  }
  std::__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset
            ((__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)cc,
             (pointer)0x0);
  return;
}

Assistant:

void AddCustomCommandToTarget(cmLocalGenerator& lg, cmCommandOrigin origin,
                              cmTarget* target, cmCustomCommandType type,
                              std::unique_ptr<cmCustomCommand> cc)
{
  // Add the command to the appropriate build step for the target.
  cc->SetEscapeAllowMakeVars(true);
  cc->SetTarget(target->GetName());

  lg.AddTargetByproducts(target, cc->GetByproducts(), cc->GetBacktrace(),
                         origin);

  switch (type) {
    case cmCustomCommandType::PRE_BUILD:
      target->AddPreBuildCommand(std::move(*cc));
      break;
    case cmCustomCommandType::PRE_LINK:
      target->AddPreLinkCommand(std::move(*cc));
      break;
    case cmCustomCommandType::POST_BUILD:
      target->AddPostBuildCommand(std::move(*cc));
      break;
  }

  cc.reset();
}